

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

PersistentRowGroupData *
duckdb::PersistentRowGroupData::Deserialize
          (PersistentRowGroupData *__return_storage_ptr__,Deserializer *deserializer)

{
  _Elt_pointer prVar1;
  int iVar2;
  undefined4 extraout_var;
  reference __args;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type __n;
  List local_78;
  PersistentColumnData local_70;
  
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,100,"types",&__return_storage_ptr__->types);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"columns");
  iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  local_78.deserializer = deserializer;
  if (CONCAT44(extraout_var,iVar2) != 0) {
    __n = 0;
    do {
      __args = vector<duckdb::LogicalType,_true>::operator[](&__return_storage_ptr__->types,__n);
      prVar1 = (deserializer->data).types.c.
               super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (prVar1 == (deserializer->data).types.c.
                    super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        ::std::
        deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
        ::_M_push_back_aux<duckdb::LogicalType_const&>
                  ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                    *)&(deserializer->data).types,__args);
      }
      else {
        prVar1->_M_data = __args;
        (deserializer->data).types.c.
        super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
      }
      Deserializer::List::ReadElement<duckdb::PersistentColumnData>(&local_70,&local_78);
      ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
      emplace_back<duckdb::PersistentColumnData>
                (&(__return_storage_ptr__->column_data).
                  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 ,&local_70);
      PersistentColumnData::~PersistentColumnData(&local_70);
      Deserializer::Unset<duckdb::LogicalType>(deserializer);
      __n = __n + 1;
    } while (CONCAT44(extraout_var,iVar2) != __n);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"start");
  iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  __return_storage_ptr__->start = CONCAT44(extraout_var_00,iVar2);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"count");
  iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  __return_storage_ptr__->count = CONCAT44(extraout_var_01,iVar2);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return __return_storage_ptr__;
}

Assistant:

PersistentRowGroupData PersistentRowGroupData::Deserialize(Deserializer &deserializer) {
	PersistentRowGroupData data;
	deserializer.ReadProperty(100, "types", data.types);
	deserializer.ReadList(101, "columns", [&](Deserializer::List &list, idx_t i) {
		deserializer.Set<const LogicalType &>(data.types[i]);
		data.column_data.push_back(list.ReadElement<PersistentColumnData>());
		deserializer.Unset<LogicalType>();
	});
	deserializer.ReadProperty(102, "start", data.start);
	deserializer.ReadProperty(103, "count", data.count);
	return data;
}